

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1223:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1223:7)>
             *this)

{
  LookupParams *params;
  String *params_1;
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  sa_family_t sVar3;
  CrossThreadPromiseFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *pCVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  int __ecode;
  _Rb_tree_node_base *p_Var7;
  int *piVar8;
  _Link_type __x;
  _Rb_tree_node_base *p_Var9;
  size_t sVar10;
  SocketAddress *extraout_RDX;
  SocketAddress *extraout_RDX_00;
  SocketAddress *extraout_RDX_01;
  SocketAddress *extraout_RDX_02;
  SocketAddress *pSVar11;
  addrinfo *paVar12;
  char *__service;
  short *__name;
  _Link_type __dest;
  Exception *exception;
  undefined1 auVar13 [16];
  Fault f;
  addrinfo *list;
  Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1223:7)>
  *local_5c8;
  set<kj::(anonymous_namespace)::SocketAddress,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
  result;
  char *local_530;
  addrinfo local_528;
  SocketAddress addr;
  Array<kj::(anonymous_namespace)::SocketAddress> result_1;
  
  p_Var1 = &result._M_t._M_impl.super__Rb_tree_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528.ai_socktype = 0;
  local_528.ai_protocol = 0;
  local_528.ai_canonname = (char *)0x0;
  local_528.ai_next = (addrinfo *)0x0;
  local_528.ai_addrlen = 0;
  local_528._20_4_ = 0;
  local_528.ai_addr = (sockaddr *)0x0;
  local_528.ai_flags = 0x28;
  local_528.ai_family = 0;
  __name = (short *)(this->f).params.host.content.ptr;
  sVar10 = (this->f).params.host.content.size_;
  if ((sVar10 == 2) && (*__name == 0x2a)) {
    __name = (short *)0x0;
  }
  else if (sVar10 == 0) {
    __name = (short *)0x4b4903;
  }
  if ((this->f).params.service.content.size_ < 2) {
    __service = (char *)0x0;
  }
  else {
    __service = (this->f).params.service.content.ptr;
  }
  local_5c8 = this;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  __ecode = getaddrinfo((char *)__name,__service,&local_528,(addrinfo **)&list);
  params = &(this->f).params;
  params_1 = &(this->f).params.service;
  if (__ecode == -0xb) {
    piVar8 = __errno_location();
    kj::_::Debug::Fault::Fault<int,kj::String&,kj::String&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x50d,*piVar8,"getaddrinfo","params.host, params.service",&params->host,params_1);
    kj::_::Debug::Fault::~Fault(&f);
  }
  else if (__ecode == 0) {
    if (list == (addrinfo *)0x0) {
      list = (addrinfo *)0x0;
    }
    else {
      paVar12 = list;
      do {
        if (((this->f).params.service.content.size_ < 2) &&
           ((paVar12->ai_addr->sa_family | 8) == 10)) {
          uVar2 = (ushort)(this->f).portHint;
          *(ushort *)paVar12->ai_addr->sa_data = uVar2 << 8 | uVar2 >> 8;
        }
        memset(&addr,0,0x88);
        if (((this->f).params.host.content.size_ == 2) &&
           (*(short *)(params->host).content.ptr == 0x2a)) {
          addr.wildcard = true;
          addr.addrlen = 0x1c;
          addr.addr.generic.sa_family = 10;
          sVar3 = paVar12->ai_addr->sa_family;
          pSVar11 = extraout_RDX;
          if ((sVar3 == 2) || (sVar3 == 10)) {
            addr.addr.inet4.sin_port = *(undefined2 *)paVar12->ai_addr->sa_data;
          }
          else {
            addr.addr.inet4.sin_port = (in_port_t)(this->f).portHint;
          }
        }
        else {
          addr.addrlen = paVar12->ai_addrlen;
          memcpy(&addr.addr,paVar12->ai_addr,(ulong)addr.addrlen);
          pSVar11 = extraout_RDX_00;
        }
        p_Var5 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var1->_M_header;
        if (result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0042e74c:
          if (p_Var9 != result._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
            auVar13 = std::_Rb_tree_decrement(p_Var9);
            goto LAB_0042e75e;
          }
LAB_0042e76e:
          if (p_Var1 == (_Rb_tree_header *)p_Var9) {
            bVar6 = true;
          }
          else {
            bVar6 = std::less<kj::(anonymous_namespace)::SocketAddress>::operator()
                              ((less<kj::(anonymous_namespace)::SocketAddress> *)&addr,
                               (SocketAddress *)(p_Var9 + 1),pSVar11);
          }
          p_Var7 = (_Rb_tree_node_base *)operator_new(0xa8);
          memcpy(p_Var7 + 1,&addr,0x88);
          std::_Rb_tree_insert_and_rebalance(bVar6,p_Var7,p_Var9,&p_Var1->_M_header);
          result._M_t._M_impl.super__Rb_tree_header._M_node_count =
               result._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
          this = local_5c8;
        }
        else {
          do {
            p_Var9 = p_Var5;
            bVar6 = std::less<kj::(anonymous_namespace)::SocketAddress>::operator()
                              ((less<kj::(anonymous_namespace)::SocketAddress> *)&addr,
                               (SocketAddress *)(p_Var9 + 1),pSVar11);
            auVar13._8_8_ = extraout_RDX_01;
            auVar13._0_8_ = p_Var9;
            p_Var5 = (&p_Var9->_M_left)[!bVar6];
            pSVar11 = extraout_RDX_01;
          } while ((&p_Var9->_M_left)[!bVar6] != (_Base_ptr)0x0);
          if (bVar6) goto LAB_0042e74c;
LAB_0042e75e:
          bVar6 = std::less<kj::(anonymous_namespace)::SocketAddress>::operator()
                            ((less<kj::(anonymous_namespace)::SocketAddress> *)
                             (auVar13._0_8_ + 0x20),&addr,auVar13._8_8_);
          pSVar11 = extraout_RDX_02;
          if (bVar6) goto LAB_0042e76e;
        }
        paVar12 = paVar12->ai_next;
      } while (paVar12 != (addrinfo *)0x0);
    }
    freeaddrinfo((addrinfo *)list);
  }
  else {
    local_530 = gai_strerror(__ecode);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,char_const(&)[19],kj::String&,kj::String&,char_const*>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x512,FAILED,(char *)0x0,
               "\"DNS lookup failed.\", params.host, params.service, gai_strerror(status)",
               (char (*) [19])"DNS lookup failed.",&params->host,params_1,&local_530);
    kj::_::Debug::Fault::~Fault(&f);
  }
  pCVar4 = (this->f).fulfiller.ptr;
  __x = (_Link_type)
        kj::_::HeapArrayDisposer::allocateImpl
                  (0x88,0,result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  __dest = __x;
  for (p_Var9 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    memmove(__dest,p_Var9 + 1,0x88);
    __dest = (_Link_type)((__dest->_M_storage)._M_storage + 0x68);
  }
  sVar10 = ((long)__dest - (long)__x >> 3) * -0xf0f0f0f0f0f0f0f;
  (*(pCVar4->super_PromiseFulfiller<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>).
    super_PromiseRejector._vptr_PromiseRejector[2])(pCVar4);
  if (__x != (_Link_type)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__x,0x88,sVar10,sVar10,
               (_func_void_void_ptr *)0x0);
  }
  std::
  _Rb_tree<kj::(anonymous_namespace)::SocketAddress,_kj::(anonymous_namespace)::SocketAddress,_std::_Identity<kj::(anonymous_namespace)::SocketAddress>,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
  ::_M_erase((_Rb_tree<kj::(anonymous_namespace)::SocketAddress,_kj::(anonymous_namespace)::SocketAddress,_std::_Identity<kj::(anonymous_namespace)::SocketAddress>,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
              *)result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }